

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O0

void __thiscall enact::CompileContext::reportErrorAt(CompileContext *this,Token *token,string *msg)

{
  ushort uVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  line_t local_d4;
  int local_a8;
  int local_a4;
  int i_1;
  int i;
  byte local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_42;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *msg_local;
  Token *token_local;
  CompileContext *this_local;
  
  local_20 = msg;
  msg_local = (string *)token;
  token_local = (Token *)this;
  poVar3 = std::operator<<((ostream *)&std::cerr,"[line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)msg_local[1]._M_string_length);
  std::operator<<(poVar3,"] Error");
  if (*(int *)msg_local == 0x47) {
    poVar3 = std::operator<<((ostream *)&std::cerr," at end: ");
    poVar3 = std::operator<<(poVar3,(string *)local_20);
    std::operator<<(poVar3,"\n\n");
  }
  else {
    if (*(int *)msg_local == 0x46) {
      std::operator<<((ostream *)&std::cerr,":\n");
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr," at ");
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &msg_local->_M_string_length,"\n");
      local_42 = 0;
      local_79 = 0;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_42 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"newline",&local_41);
      }
      else {
        std::operator+(&local_78,"\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &msg_local->_M_string_length);
        local_79 = 1;
        std::operator+(&local_40,&local_78,"\'");
      }
      poVar3 = std::operator<<(poVar3,(string *)&local_40);
      std::operator<<(poVar3,":\n");
      std::__cxx11::string::~string((string *)&local_40);
      if ((local_79 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_78);
      }
      if ((local_42 & 1) != 0) {
        std::allocator<char>::~allocator(&local_41);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &msg_local->_M_string_length,"\n");
    if (bVar2) {
      local_d4 = (int)msg_local[1]._M_string_length - 1;
    }
    else {
      local_d4 = (line_t)msg_local[1]._M_string_length;
    }
    getSourceLine_abi_cxx11_((string *)&i_1,this,local_d4);
    poVar3 = std::operator<<(poVar3,(string *)&i_1);
    std::operator<<(poVar3,"\n    ");
    std::__cxx11::string::~string((string *)&i_1);
    for (local_a4 = 1; uVar1 = *(ushort *)((long)&msg_local[1]._M_string_length + 4),
        lVar4 = std::__cxx11::string::size(), (ulong)(long)local_a4 <= (ulong)uVar1 - lVar4;
        local_a4 = local_a4 + 1) {
      std::operator<<((ostream *)&std::cerr," ");
    }
    for (local_a8 = 1; uVar5 = std::__cxx11::string::size(), (ulong)(long)local_a8 <= uVar5;
        local_a8 = local_a8 + 1) {
      std::operator<<((ostream *)&std::cerr,"^");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    poVar3 = std::operator<<(poVar3,(string *)local_20);
    std::operator<<(poVar3,"\n\n");
  }
  return;
}

Assistant:

void CompileContext::reportErrorAt(const Token &token, const std::string &msg) {
        std::cerr << "[line " << token.line << "] Error";

        if (token.type == TokenType::END_OF_FILE) {
            std::cerr << " at end: " << msg << "\n\n";
        } else {
            if (token.type == TokenType::ERROR) {
                std::cerr << ":\n";
            } else {
                std::cerr << " at " << (token.lexeme == "\n" ? "newline" : "'" + token.lexeme + "'") << ":\n";
            }

            std::cerr << "    " << getSourceLine(token.lexeme == "\n" ? token.line - 1 : token.line) << "\n    ";
            for (int i = 1; i <= token.col - token.lexeme.size(); ++i) {
                std::cerr << " ";
            }

            for (int i = 1; i <= token.lexeme.size(); ++i) {
                std::cerr << "^";
            }
            std::cerr << "\n" << msg << "\n\n";
        }
    }